

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# occurrencetocsv.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  undefined8 extraout_RAX;
  bool skipheader;
  char *__end;
  pointer unaff_R12;
  string local_68;
  string local_48;
  
  bVar1 = false;
  do {
    skipheader = bVar1;
    iVar2 = getopt(argc,argv,"vh");
    bVar1 = true;
  } while (iVar2 == 0x73);
  if (iVar2 == -1) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"","");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"","");
    initstreams(&local_48,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    doit(skipheader);
    return 0;
  }
  if (iVar2 == 0x76) {
    main_cold_1();
  }
  main_cold_2();
  if (local_68._M_dataplus._M_p != unaff_R12) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_48._M_dataplus._M_p != "vh") {
    operator_delete(local_48._M_dataplus._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char* argv[])
{
	int opt;
	bool skipheader = false;
	while ((opt = getopt(argc, argv, "vh")) != -1) {
		switch (opt) {
		case 's':
			skipheader = true;
			break;
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			exit(EXIT_FAILURE);
			break;
		case 'h':
		default:
			help();
			exit(EXIT_FAILURE);
		}
	}

	initstreams();

	doit(skipheader);
	return EXIT_SUCCESS;
}